

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-bind.h
# Opt level: O2

void __thiscall
dynamicgraph::command::CommandVoid1<dynamicgraph::CustomEntity,_int>::CommandVoid1
          (CommandVoid1<dynamicgraph::CustomEntity,_int> *this,CustomEntity *entity,
          function_t *function,string *docString)

{
  _Vector_base<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
  local_90;
  _Deque_base<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
  local_78;
  
  boost::assign::list_of<dynamicgraph::command::Value::Type_const&>
            ((generic_list<dynamicgraph::command::Value::Type> *)&local_78,
             (assign *)&ValueHelper<int>::TypeID,(Type *)function);
  boost::assign_detail::
  converter<boost::assign_detail::generic_list<dynamicgraph::command::Value::Type>,std::_Deque_iterator<dynamicgraph::command::Value::Type,dynamicgraph::command::Value::Type&,dynamicgraph::command::Value::Type*>>
  ::
  convert_to_container<std::vector<dynamicgraph::command::Value::Type,std::allocator<dynamicgraph::command::Value::Type>>>
            ((vector<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
              *)&local_90,&local_78);
  dynamicgraph::command::Command::Command
            (&this->super_Command,&entity->super_Entity,(vector *)&local_90,(string *)docString);
  std::
  _Vector_base<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
  ::~_Vector_base(&local_90);
  std::
  _Deque_base<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
  ::~_Deque_base(&local_78);
  *(undefined ***)this = &PTR__CommandVoid1_0011ca20;
  boost::function1<void,_const_int_&>::function1
            (&(this->fptr).super_function1<void,_const_int_&>,
             &function->super_function1<void,_const_int_&>);
  return;
}

Assistant:

CommandVoid1(E &entity, function_t function, const std::string &docString)
      : Command(entity, boost::assign::list_of(ValueHelper<T>::TypeID),
                docString),
        fptr(function) {}